

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigRetMin.c
# Opt level: O1

Vec_Int_t * Saig_ManRetimeInitState(Aig_Man_t *p)

{
  uint uVar1;
  int *pVars;
  uint uVar2;
  int iVar3;
  Cnf_Dat_t *p_00;
  sat_solver *s;
  uint *__ptr;
  void *pvVar4;
  Vec_Ptr_t *pVVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  
  p_00 = Cnf_DeriveSimpleForRetiming(p);
  pVVar7 = (Vec_Int_t *)0x0;
  s = (sat_solver *)Cnf_DataWriteIntoSolver(p_00,1,0);
  if (s != (sat_solver *)0x0) {
    pVVar7 = (Vec_Int_t *)0x0;
    iVar3 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,1000000,0,0,0);
    if (iVar3 == 1) {
      uVar1 = p->nObjs[2];
      __ptr = (uint *)malloc(0x10);
      uVar8 = 0x10;
      if (0xe < uVar1 - 1) {
        uVar8 = uVar1;
      }
      __ptr[1] = 0;
      *__ptr = uVar8;
      if (uVar8 == 0) {
        pvVar4 = (void *)0x0;
      }
      else {
        pvVar4 = malloc((long)(int)uVar8 << 2);
      }
      *(void **)(__ptr + 2) = pvVar4;
      pVVar5 = p->vCis;
      if (0 < pVVar5->nSize) {
        uVar1 = __ptr[1];
        uVar8 = *__ptr;
        lVar9 = 0;
        do {
          iVar3 = p_00->pVarNums[*(int *)((long)pVVar5->pArray[lVar9] + 0x24)];
          uVar2 = uVar8;
          if (uVar1 + (int)lVar9 == uVar8) {
            if ((int)uVar8 < 0x10) {
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar4 = malloc(0x40);
              }
              else {
                pvVar4 = realloc(*(void **)(__ptr + 2),0x40);
              }
              *(void **)(__ptr + 2) = pvVar4;
              uVar10 = 0x10;
            }
            else {
              uVar10 = uVar8 * 2;
              if ((int)uVar10 <= (int)uVar8) goto LAB_0063245a;
              if (*(void **)(__ptr + 2) == (void *)0x0) {
                pvVar4 = malloc((ulong)uVar10 << 2);
              }
              else {
                pvVar4 = realloc(*(void **)(__ptr + 2),(ulong)uVar10 << 2);
              }
              *(void **)(__ptr + 2) = pvVar4;
            }
            uVar2 = uVar10;
            if (pvVar4 == (void *)0x0) {
              __ptr[1] = uVar1 + (int)lVar9;
              *__ptr = uVar8;
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
          }
LAB_0063245a:
          uVar8 = uVar2;
          *(int *)(*(long *)(__ptr + 2) + (long)(int)uVar1 * 4 + lVar9 * 4) = iVar3;
          lVar9 = lVar9 + 1;
          pVVar5 = p->vCis;
        } while (lVar9 < pVVar5->nSize);
        __ptr[1] = (int)lVar9 + uVar1;
        *__ptr = uVar8;
      }
      pVars = *(int **)(__ptr + 2);
      piVar6 = Sat_SolverGetModel(s,pVars,__ptr[1]);
      iVar3 = p->nObjs[2];
      pVVar7 = (Vec_Int_t *)malloc(0x10);
      pVVar7->nSize = iVar3;
      pVVar7->nCap = iVar3;
      pVVar7->pArray = piVar6;
      if (pVars != (int *)0x0) {
        free(pVars);
        __ptr[2] = 0;
        __ptr[3] = 0;
      }
      free(__ptr);
    }
    else if (iVar3 == 0) {
      __assert_fail("RetValue != l_Undef",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/saig/saigRetMin.c"
                    ,0x43,"Vec_Int_t *Saig_ManRetimeInitState(Aig_Man_t *)");
    }
    sat_solver_delete(s);
  }
  Cnf_DataFree(p_00);
  return pVVar7;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Derives the initial state after backward retiming.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Vec_Int_t * Saig_ManRetimeInitState( Aig_Man_t * p )
{
    int nConfLimit = 1000000;
    Vec_Int_t * vCiIds, * vInit = NULL;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Aig_Obj_t * pObj;
    int i, RetValue, * pModel;
    // solve the SAT problem
    pCnf = Cnf_DeriveSimpleForRetiming( p );
    pSat = (sat_solver *)Cnf_DataWriteIntoSolver( pCnf, 1, 0 );
    if ( pSat == NULL )
    {
        Cnf_DataFree( pCnf );
        return NULL;
    }
    RetValue = sat_solver_solve( pSat, NULL, NULL, (ABC_INT64_T)nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    assert( RetValue != l_Undef );
    // create counter-example
    if ( RetValue == l_True )
    {
        // accumulate SAT variables of the CIs
        vCiIds = Vec_IntAlloc( Aig_ManCiNum(p) );
        Aig_ManForEachCi( p, pObj, i )
            Vec_IntPush( vCiIds, pCnf->pVarNums[pObj->Id] );
        // create the model
        pModel = Sat_SolverGetModel( pSat, vCiIds->pArray, vCiIds->nSize );
        vInit = Vec_IntAllocArray( pModel, Aig_ManCiNum(p) );
        Vec_IntFree( vCiIds );
    }
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    return vInit;
}